

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pragmaVtabColumn(sqlite3_vtab_cursor *pVtabCursor,sqlite3_context *ctx,int i)

{
  byte bVar1;
  sqlite3_value *pFrom;
  
  bVar1 = *(byte *)((long)&pVtabCursor->pVtab[1].zErrMsg + 1);
  if (i < (int)(uint)bVar1) {
    pFrom = sqlite3_column_value((sqlite3_stmt *)pVtabCursor[1].pVtab,i);
    sqlite3VdbeMemCopy(ctx->pOut,pFrom);
  }
  else {
    setResultStrOrError(ctx,(char *)pVtabCursor[((long)i - (ulong)bVar1) + 3].pVtab,-1,'\x01',
                        (_func_void_void_ptr *)0xffffffffffffffff);
  }
  return 0;
}

Assistant:

static int pragmaVtabColumn(
  sqlite3_vtab_cursor *pVtabCursor, 
  sqlite3_context *ctx, 
  int i
){
  PragmaVtabCursor *pCsr = (PragmaVtabCursor*)pVtabCursor;
  PragmaVtab *pTab = (PragmaVtab*)(pVtabCursor->pVtab);
  if( i<pTab->iHidden ){
    sqlite3_result_value(ctx, sqlite3_column_value(pCsr->pPragma, i));
  }else{
    sqlite3_result_text(ctx, pCsr->azArg[i-pTab->iHidden],-1,SQLITE_TRANSIENT);
  }
  return SQLITE_OK;
}